

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cc
# Opt level: O2

NativeCallback * __thiscall flow::Runtime::registerHandler(Runtime *this,string *name)

{
  unique_ptr<flow::NativeCallback,_std::default_delete<flow::NativeCallback>_> uStack_28;
  _Alloc_hider local_20;
  
  local_20._M_p = (pointer)this;
  std::make_unique<flow::NativeCallback,flow::Runtime*,std::__cxx11::string_const&>
            ((Runtime **)&uStack_28,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_20);
  std::
  vector<std::unique_ptr<flow::NativeCallback,std::default_delete<flow::NativeCallback>>,std::allocator<std::unique_ptr<flow::NativeCallback,std::default_delete<flow::NativeCallback>>>>
  ::emplace_back<std::unique_ptr<flow::NativeCallback,std::default_delete<flow::NativeCallback>>>
            ((vector<std::unique_ptr<flow::NativeCallback,std::default_delete<flow::NativeCallback>>,std::allocator<std::unique_ptr<flow::NativeCallback,std::default_delete<flow::NativeCallback>>>>
              *)&this->builtins_,&uStack_28);
  std::unique_ptr<flow::NativeCallback,_std::default_delete<flow::NativeCallback>_>::~unique_ptr
            (&uStack_28);
  return (this->builtins_).
         super__Vector_base<std::unique_ptr<flow::NativeCallback,_std::default_delete<flow::NativeCallback>_>,_std::allocator<std::unique_ptr<flow::NativeCallback,_std::default_delete<flow::NativeCallback>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
         super___uniq_ptr_impl<flow::NativeCallback,_std::default_delete<flow::NativeCallback>_>.
         _M_t.
         super__Tuple_impl<0UL,_flow::NativeCallback_*,_std::default_delete<flow::NativeCallback>_>.
         super__Head_base<0UL,_flow::NativeCallback_*,_false>._M_head_impl;
}

Assistant:

NativeCallback& Runtime::registerHandler(const std::string& name) {
  builtins_.push_back(std::make_unique<NativeCallback>(this, name));
  return *builtins_[builtins_.size() - 1];
}